

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O3

bool __thiscall
vkt::texture::SampleVerifier::verifySampleMipmapLevel
          (SampleVerifier *this,SampleArguments *args,Vec4 *result,Vec4 *coord,Vec2 *lodBounds,
          int level,ostream *report)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  bool bVar5;
  int iVar6;
  IVec3 *pIVar7;
  Vector<int,_3> *pVVar8;
  Vector<int,_3> *pVVar9;
  long lVar10;
  Vector<int,_3> local_128;
  IVec3 IStack_11c;
  IVec3 local_108;
  Vector<int,_3> VStack_fc;
  ulong local_f0;
  Vec4 *local_e8;
  SampleVerifier *local_e0;
  ulong local_d8;
  SampleArguments *local_d0;
  Vec4 *local_c8;
  Vec2 *local_c0;
  Vec3 local_b8;
  Vec3 VStack_ac;
  Vec3 local_98;
  Vec3 VStack_8c;
  IVec3 gridCoord [2];
  FloatFormat coordFormat;
  
  local_f0 = 0;
  if (this->m_imParams->levels + -1 != level) {
    local_f0 = (ulong)this->m_samplerParams->mipmapFilter;
  }
  VStack_8c.m_data[1] = 0.0;
  VStack_8c.m_data[2] = 0.0;
  local_98.m_data[0] = 0.0;
  local_98.m_data[1] = 0.0;
  local_98.m_data[2] = 0.0;
  VStack_8c.m_data[0] = 0.0;
  VStack_ac.m_data[1] = 0.0;
  VStack_ac.m_data[2] = 0.0;
  local_b8.m_data[0] = 0.0;
  local_b8.m_data[1] = 0.0;
  local_b8.m_data[2] = 0.0;
  VStack_ac.m_data[0] = 0.0;
  VStack_fc.m_data[1] = 0;
  VStack_fc.m_data[2] = 0;
  local_108.m_data[0] = 0;
  local_108.m_data[1] = 0;
  local_108.m_data[2] = 0;
  VStack_fc.m_data[0] = 0;
  IStack_11c.m_data[1] = 0;
  IStack_11c.m_data[2] = 0;
  local_128.m_data[0] = 0;
  local_128.m_data[1] = 0;
  local_128.m_data[2] = 0;
  IStack_11c.m_data[0] = 0;
  local_d0 = args;
  local_c8 = result;
  local_c0 = lodBounds;
  tcu::FloatFormat::FloatFormat(&coordFormat,-0x20,0x20,0x10,true,MAYBE,MAYBE,MAYBE);
  local_e8 = coord;
  util::calcUnnormalizedCoordRange
            (coord,&(this->m_levels->
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    )._M_impl.super__Vector_impl_data._M_start[level].m_size,&coordFormat,&local_98,
             &local_b8);
  util::calcTexelGridCoordRange(&local_98,&local_b8,this->m_coordBits,&local_108,&local_128);
  std::__ostream_insert<char,std::char_traits<char>>(report,"Level ",6);
  poVar4 = (ostream *)std::ostream::operator<<(report,level);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4," computed unnormalized coordinate range: [",0x2a);
  poVar4 = tcu::operator<<(poVar4,&local_98);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  poVar4 = tcu::operator<<(poVar4,&local_b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(report,"Level ",6);
  poVar4 = (ostream *)std::ostream::operator<<(report,level);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4," computed texel grid coordinate range: [",0x28);
  poVar4 = tcu::operator<<(poVar4,&local_108);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  poVar4 = tcu::operator<<(poVar4,&local_128);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]\n",2);
  local_e0 = this;
  local_d8 = (ulong)(uint)level;
  if ((int)local_f0 == 1) {
    iVar6 = level + 1;
    util::calcUnnormalizedCoordRange
              (local_e8,&(this->m_levels->
                         super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                         )._M_impl.super__Vector_impl_data._M_start[iVar6].m_size,&coordFormat,
               &VStack_8c,&VStack_ac);
    util::calcTexelGridCoordRange(&VStack_8c,&VStack_ac,this->m_coordBits,&VStack_fc,&IStack_11c);
    std::__ostream_insert<char,std::char_traits<char>>(report,"Level ",6);
    poVar4 = (ostream *)std::ostream::operator<<(report,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," computed unnormalized coordinate range: [",0x2a);
    poVar4 = tcu::operator<<(poVar4,&VStack_8c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," - ",3);
    poVar4 = tcu::operator<<(poVar4,&VStack_ac);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(report,"Level ",6);
    poVar4 = (ostream *)std::ostream::operator<<(report,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," computed texel grid coordinate range: [",0x28);
    poVar4 = tcu::operator<<(poVar4,&VStack_fc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," - ",3);
    poVar4 = tcu::operator<<(poVar4,&IStack_11c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]\n",2);
  }
  else {
    VStack_ac.m_data[2] = 0.0;
    VStack_ac.m_data[0] = 0.0;
    VStack_ac.m_data[1] = 0.0;
    VStack_8c.m_data[2] = 0.0;
    VStack_8c.m_data[0] = 0.0;
    VStack_8c.m_data[1] = 0.0;
    IStack_11c.m_data[2] = 0;
    IStack_11c.m_data[0] = 0;
    IStack_11c.m_data[1] = 0;
    VStack_fc.m_data[2] = 0;
    VStack_fc.m_data[0] = 0;
    VStack_fc.m_data[1] = 0;
  }
  gridCoord[0].m_data[2] = local_108.m_data[2];
  gridCoord[0].m_data[0] = local_108.m_data[0];
  gridCoord[0].m_data[1] = local_108.m_data[1];
  gridCoord[1].m_data[1] = VStack_fc.m_data[1];
  gridCoord[1].m_data[0] = VStack_fc.m_data[0];
  gridCoord[1].m_data[2] = VStack_fc.m_data[2];
  do {
    bVar3 = verifySampleTexelGridCoords
                      (local_e0,local_d0,local_c8,gridCoord,gridCoord + 1,local_c0,(int)local_d8,
                       (VkSamplerMipmapMode)local_f0,report);
    if (bVar3) {
      return bVar3;
    }
    bVar1 = true;
    pIVar7 = gridCoord;
    pVVar8 = &local_128;
    pVVar9 = &local_108;
    bVar2 = true;
    do {
      bVar5 = bVar2;
      lVar10 = 0;
      do {
        if (bVar1) {
          iVar6 = pIVar7->m_data[lVar10] + 1;
          pIVar7->m_data[lVar10] = iVar6;
          if (pVVar8->m_data[lVar10] < iVar6) {
            pIVar7->m_data[lVar10] = pVVar9->m_data[lVar10];
          }
          else {
            bVar1 = false;
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      pIVar7 = gridCoord + 1;
      pVVar8 = &IStack_11c;
      pVVar9 = &VStack_fc;
      bVar2 = false;
    } while (bVar5);
  } while (!bVar1);
  return bVar3;
}

Assistant:

bool SampleVerifier::verifySampleMipmapLevel (const SampleArguments&	args,
											  const Vec4&				result,
											  const Vec4&				coord,
											  const Vec2&				lodBounds,
											  int						level,
											  std::ostream&				report) const
{
	DE_ASSERT(level < m_imParams.levels);

	VkSamplerMipmapMode mipmapFilter = m_samplerParams.mipmapFilter;

	if (level == m_imParams.levels - 1)
	{
		mipmapFilter = VK_SAMPLER_MIPMAP_MODE_NEAREST;
	}

	Vec3	unnormalizedCoordMin[2];
	Vec3	unnormalizedCoordMax[2];
	IVec3	gridCoordMin[2];
	IVec3	gridCoordMax[2];

	const FloatFormat coordFormat(-32, 32, 16, true);

	calcUnnormalizedCoordRange(coord,
							   m_levels[level].getSize(),
							   coordFormat,
							   unnormalizedCoordMin[0],
							   unnormalizedCoordMax[0]);

	calcTexelGridCoordRange(unnormalizedCoordMin[0],
							unnormalizedCoordMax[0],
							m_coordBits,
							gridCoordMin[0],
							gridCoordMax[0]);

	report << "Level " << level << " computed unnormalized coordinate range: [" << unnormalizedCoordMin[0] << ", " << unnormalizedCoordMax[0] << "]\n";
	report << "Level " << level << " computed texel grid coordinate range: [" << gridCoordMin[0] << ", " << gridCoordMax[0] << "]\n";

	if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR)
	{
		calcUnnormalizedCoordRange(coord,
								   m_levels[level+1].getSize(),
								   coordFormat,
								   unnormalizedCoordMin[1],
								   unnormalizedCoordMax[1]);

		calcTexelGridCoordRange(unnormalizedCoordMin[1],
								unnormalizedCoordMax[1],
								m_coordBits,
								gridCoordMin[1],
								gridCoordMax[1]);


		report << "Level " << level+1 << " computed unnormalized coordinate range: [" << unnormalizedCoordMin[1] << " - " << unnormalizedCoordMax[1] << "]\n";
		report << "Level " << level+1 << " computed texel grid coordinate range: [" << gridCoordMin[1] << " - " << gridCoordMax[1] << "]\n";
	}
	else
	{
		unnormalizedCoordMin[1] = unnormalizedCoordMax[1] = Vec3(0.0f);
		gridCoordMin[1] = gridCoordMax[1] = IVec3(0);
	}

	bool done = false;

	IVec3 gridCoord[2] = {gridCoordMin[0], gridCoordMin[1]};

    while (!done)
	{
		if (verifySampleTexelGridCoords(args, result, gridCoord[0], gridCoord[1], lodBounds, level, mipmapFilter, report))
			return true;

		// Get next grid coordinate to test at

		// Represents whether the increment at a position wraps and should "carry" to the next place
		bool carry = true;

		for (int levelNdx = 0; levelNdx < 2; ++levelNdx)
		{
			for (int compNdx = 0; compNdx < 3; ++compNdx)
			{
				if (carry)
				{
					deInt32& comp = gridCoord[levelNdx][compNdx];
				    ++comp;

					if (comp > gridCoordMax[levelNdx][compNdx])
					{
						comp = gridCoordMin[levelNdx][compNdx];
					}
					else
					{
						carry = false;
					}
				}
			}
		}

		done = carry;
	}

	return false;
}